

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::wait_op>::pop(op_queue<asio::detail::wait_op> *this)

{
  wait_op *pwVar1;
  long *in_RDI;
  wait_op *tmp;
  wait_op *local_10 [2];
  
  if (*in_RDI != 0) {
    local_10[0] = (wait_op *)*in_RDI;
    pwVar1 = op_queue_access::next<asio::detail::wait_op>((wait_op *)*in_RDI);
    *in_RDI = (long)pwVar1;
    if (*in_RDI == 0) {
      in_RDI[1] = 0;
    }
    op_queue_access::next<asio::detail::wait_op,asio::detail::wait_op>(local_10,(wait_op *)0x0);
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }